

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsNodeQueue.cpp
# Opt level: O0

int __thiscall HighsNodeQueue::unlink(HighsNodeQueue *this,char *__name)

{
  int extraout_EAX;
  reference pvVar1;
  HighsNodeQueue *unaff_retaddr;
  value_type *in_stack_00000008;
  HighsNodeQueue *in_stack_00000010;
  int64_t in_stack_00000038;
  HighsNodeQueue *in_stack_00000040;
  
  pvVar1 = std::vector<HighsNodeQueue::OpenNode,_std::allocator<HighsNodeQueue::OpenNode>_>::
           operator[](&this->nodes,(size_type)__name);
  if ((pvVar1->estimate != INFINITY) || (NAN(pvVar1->estimate))) {
    unlink_estim(unaff_retaddr,(int64_t)this);
    unlink_lower(unaff_retaddr,(int64_t)this);
  }
  else {
    unlink_suboptimal(in_stack_00000010,(int64_t)in_stack_00000008);
  }
  unlink_domchgs(in_stack_00000040,in_stack_00000038);
  std::priority_queue<long,_std::vector<long,_std::allocator<long>_>,_std::greater<long>_>::push
            ((priority_queue<long,_std::vector<long,_std::allocator<long>_>,_std::greater<long>_> *)
             in_stack_00000010,in_stack_00000008);
  return extraout_EAX;
}

Assistant:

void HighsNodeQueue::unlink(int64_t node) {
  if (nodes[node].estimate == kHighsInf) {
    unlink_suboptimal(node);
  } else {
    unlink_estim(node);
    unlink_lower(node);
  }
  unlink_domchgs(node);
  freeslots.push(node);
}